

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

Error * ot::commissioner::CommissionerImpl::EncodeActiveOperationalDataset
                  (Error *__return_storage_ptr__,Request *aRequest,
                  ActiveOperationalDataset *aDataset)

{
  ushort uVar1;
  ErrorCode EVar2;
  Error *pEVar3;
  uint64_t aValue;
  Tlv local_80;
  undefined1 local_60 [40];
  ByteArray value;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  uVar1 = aDataset->mPresentFlags;
  if ((short)uVar1 < 0) {
    aValue = Timestamp::Encode(&aDataset->mActiveTimestamp);
    tlv::Tlv::Tlv(&local_80,kActiveTimestamp,aValue,kMeshCoP);
    AppendTlv((Error *)local_60,aRequest,&local_80);
    pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)local_60);
    EVar2 = pEVar3->mCode;
    std::__cxx11::string::~string((string *)(local_60 + 8));
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&local_80.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    uVar1 = aDataset->mPresentFlags;
  }
  if ((uVar1 >> 0xe & 1) != 0) {
    value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    utils::Encode<unsigned_char>(&value,(aDataset->mChannel).mPage);
    utils::Encode<unsigned_short>(&value,(aDataset->mChannel).mNumber);
    tlv::Tlv::Tlv(&local_80,kChannel,&value,kMeshCoP);
    AppendTlv((Error *)local_60,aRequest,&local_80);
    pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)local_60);
    EVar2 = pEVar3->mCode;
    std::__cxx11::string::~string((string *)(local_60 + 8));
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&local_80.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    uVar1 = aDataset->mPresentFlags;
  }
  if ((uVar1 >> 0xd & 1) != 0) {
    value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    EncodeChannelMask((Error *)local_60,&value,&aDataset->mChannelMask);
    pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)local_60);
    EVar2 = pEVar3->mCode;
    std::__cxx11::string::~string((string *)(local_60 + 8));
    if (EVar2 != kNone) goto LAB_0019561b;
    tlv::Tlv::Tlv(&local_80,kChannelMask,&value,kMeshCoP);
    AppendTlv((Error *)local_60,aRequest,&local_80);
    pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)local_60);
    EVar2 = pEVar3->mCode;
    std::__cxx11::string::~string((string *)(local_60 + 8));
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&local_80.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    uVar1 = aDataset->mPresentFlags;
  }
  if ((uVar1 >> 0xc & 1) != 0) {
    tlv::Tlv::Tlv(&local_80,kExtendedPanId,&aDataset->mExtendedPanId,kMeshCoP);
    AppendTlv((Error *)local_60,aRequest,&local_80);
    pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)local_60);
    EVar2 = pEVar3->mCode;
    std::__cxx11::string::~string((string *)(local_60 + 8));
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&local_80.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    uVar1 = aDataset->mPresentFlags;
  }
  if ((uVar1 >> 0xb & 1) != 0) {
    tlv::Tlv::Tlv(&local_80,kNetworkDiagNetworkData,&aDataset->mMeshLocalPrefix,kMeshCoP);
    AppendTlv((Error *)local_60,aRequest,&local_80);
    pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)local_60);
    EVar2 = pEVar3->mCode;
    std::__cxx11::string::~string((string *)(local_60 + 8));
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&local_80.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    uVar1 = aDataset->mPresentFlags;
  }
  if ((uVar1 >> 10 & 1) != 0) {
    tlv::Tlv::Tlv(&local_80,kNetworkDiagRoute64,&aDataset->mNetworkMasterKey,kMeshCoP);
    AppendTlv((Error *)local_60,aRequest,&local_80);
    pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)local_60);
    EVar2 = pEVar3->mCode;
    std::__cxx11::string::~string((string *)(local_60 + 8));
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&local_80.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    uVar1 = aDataset->mPresentFlags;
  }
  if ((uVar1 >> 9 & 1) != 0) {
    tlv::Tlv::Tlv(&local_80,kNetworkDiagTimeout,&aDataset->mNetworkName,kMeshCoP);
    AppendTlv((Error *)local_60,aRequest,&local_80);
    pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)local_60);
    EVar2 = pEVar3->mCode;
    std::__cxx11::string::~string((string *)(local_60 + 8));
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&local_80.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    uVar1 = aDataset->mPresentFlags;
  }
  if ((uVar1 >> 8 & 1) != 0) {
    tlv::Tlv::Tlv(&local_80,kNetworkDiagMacAddress,aDataset->mPanId,kMeshCoP);
    AppendTlv((Error *)local_60,aRequest,&local_80);
    pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)local_60);
    EVar2 = pEVar3->mCode;
    std::__cxx11::string::~string((string *)(local_60 + 8));
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&local_80.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    uVar1 = aDataset->mPresentFlags;
  }
  if ((char)uVar1 < '\0') {
    tlv::Tlv::Tlv(&local_80,kNetworkDiagConnectivity,&aDataset->mPSKc,kMeshCoP);
    AppendTlv((Error *)local_60,aRequest,&local_80);
    pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)local_60);
    EVar2 = pEVar3->mCode;
    std::__cxx11::string::~string((string *)(local_60 + 8));
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&local_80.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    uVar1 = aDataset->mPresentFlags;
  }
  if ((uVar1 & 0x40) == 0) {
    return __return_storage_ptr__;
  }
  value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  utils::Encode<unsigned_short>(&value,(aDataset->mSecurityPolicy).mRotationTime);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&value,
             (const_iterator)
             value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(aDataset->mSecurityPolicy).mFlags.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(aDataset->mSecurityPolicy).mFlags.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  tlv::Tlv::Tlv(&local_80,kSecurityPolicy,&value,kMeshCoP);
  AppendTlv((Error *)local_60,aRequest,&local_80);
  Error::operator=(__return_storage_ptr__,(Error *)local_60);
  std::__cxx11::string::~string((string *)(local_60 + 8));
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_80.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
LAB_0019561b:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::EncodeActiveOperationalDataset(coap::Request                  &aRequest,
                                                       const ActiveOperationalDataset &aDataset)
{
    Error error;

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kActiveTimestampBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kActiveTimestamp, aDataset.mActiveTimestamp.Encode()}));
    }

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kChannelBit)
    {
        ByteArray value;
        utils::Encode(value, aDataset.mChannel.mPage);
        utils::Encode(value, aDataset.mChannel.mNumber);
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kChannel, value}));
    }

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kChannelMaskBit)
    {
        ByteArray value;
        SuccessOrExit(error = EncodeChannelMask(value, aDataset.mChannelMask));
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kChannelMask, value}));
    }

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kExtendedPanIdBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kExtendedPanId, aDataset.mExtendedPanId}));
    }

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kMeshLocalPrefixBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kNetworkMeshLocalPrefix, aDataset.mMeshLocalPrefix}));
    }

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kNetworkMasterKeyBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kNetworkMasterKey, aDataset.mNetworkMasterKey}));
    }

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kNetworkNameBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kNetworkName, aDataset.mNetworkName}));
    }

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kPanIdBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kPanId, aDataset.mPanId}));
    }

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kPSKcBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kPSKc, aDataset.mPSKc}));
    }

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kSecurityPolicyBit)
    {
        ByteArray value;
        utils::Encode(value, aDataset.mSecurityPolicy.mRotationTime);
        value.insert(value.end(), aDataset.mSecurityPolicy.mFlags.begin(), aDataset.mSecurityPolicy.mFlags.end());
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kSecurityPolicy, value}));
    }

exit:
    return error;
}